

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O3

void apply_imputation_results<PredictionData<float,int>,ImputedData<int,double>>
               (PredictionData<float,_int> *prediction_data,ImputedData<int,_double> *imp,
               Imputer *imputer,size_t row)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  pointer puVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  float *pfVar8;
  unsigned_long uVar9;
  pointer piVar10;
  pointer pvVar11;
  pointer pvVar12;
  int *piVar13;
  double *pdVar14;
  double *pdVar15;
  double *pdVar16;
  size_t sVar17;
  long lVar18;
  size_t sVar19;
  long lVar20;
  double *pdVar21;
  int iVar22;
  double *pdVar23;
  double dVar24;
  double dVar25;
  
  bVar1 = prediction_data->is_col_major;
  sVar3 = imp->n_missing_num;
  if (bVar1 == false) {
    if (sVar3 != 0) {
      puVar4 = (imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar5 = (imp->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (imp->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar17 = imputer->ncols_numeric;
      pfVar8 = prediction_data->numeric_data;
      pdVar7 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar19 = 0;
      do {
        uVar9 = puVar4[sVar19];
        dVar25 = pdVar6[sVar19];
        if (((dVar25 <= 0.0) || (dVar24 = pdVar5[sVar19], 0x7fefffffffffffff < (ulong)ABS(dVar24)))
           || ((dVar24 == 0.0 && ((!NAN(dVar24) && (NAN(pdVar7[uVar9]))))))) {
          dVar24 = pdVar7[uVar9];
        }
        else {
          dVar24 = dVar24 / dVar25;
        }
        pfVar8[sVar17 * row + uVar9] = (float)dVar24;
        sVar19 = sVar19 + 1;
      } while (sVar3 != sVar19);
    }
  }
  else if (sVar3 != 0) {
    puVar4 = (imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar5 = (imp->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (imp->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar8 = prediction_data->numeric_data;
    sVar17 = prediction_data->nrows;
    sVar19 = 0;
    do {
      uVar9 = puVar4[sVar19];
      dVar25 = pdVar6[sVar19];
      if (((dVar25 <= 0.0) || (dVar24 = pdVar5[sVar19], 0x7fefffffffffffff < (ulong)ABS(dVar24))) ||
         ((dVar24 == 0.0 && ((!NAN(dVar24) && (NAN(pdVar7[uVar9]))))))) {
        dVar24 = pdVar7[uVar9];
      }
      else {
        dVar24 = dVar24 / dVar25;
      }
      pfVar8[row + uVar9 * sVar17] = (float)dVar24;
      sVar19 = sVar19 + 1;
    } while (sVar3 != sVar19);
  }
  pfVar8 = prediction_data->Xr;
  if (pfVar8 != (float *)0x0) {
    iVar22 = prediction_data->Xr_indptr[row];
    lVar18 = (long)iVar22;
    iVar2 = prediction_data->Xr_indptr[row + 1];
    if (iVar22 < iVar2) {
      pdVar5 = (imp->sp_num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (imp->sp_num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar10 = (imp->missing_sp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar7 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar20 = 0;
      do {
        if (0x7f7fffff < (uint)ABS(pfVar8[lVar18])) {
          dVar25 = pdVar6[lVar20];
          if ((dVar25 <= 0.0) || (dVar24 = pdVar5[lVar20], 0x7fefffffffffffff < (ulong)ABS(dVar24)))
          {
            dVar24 = pdVar7[piVar10[lVar20]];
          }
          else {
            dVar24 = dVar24 / dVar25;
          }
          pfVar8[lVar18] = (float)dVar24;
          lVar20 = lVar20 + 1;
        }
        lVar18 = lVar18 + 1;
      } while (iVar2 != lVar18);
    }
  }
  sVar3 = imp->n_missing_cat;
  if (bVar1 == false) {
    if (sVar3 != 0) {
      puVar4 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar18 = row * imputer->ncols_categ;
      pvVar11 = (imp->cat_sum).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      piVar13 = prediction_data->categ_data;
      pvVar12 = (imp->cat_sum).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      piVar10 = (imputer->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      sVar17 = 0;
      do {
        uVar9 = puVar4[sVar17];
        pdVar14 = pvVar11[uVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar15 = pvVar11[uVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pdVar21 = pdVar14 + 1;
        pdVar23 = pdVar14;
        if (pdVar21 != pdVar15 && pdVar14 != pdVar15) {
          dVar25 = *pdVar14;
          do {
            dVar24 = *pdVar21;
            pdVar16 = pdVar21;
            if (dVar24 <= dVar25) {
              dVar24 = dVar25;
              pdVar16 = pdVar23;
            }
            pdVar23 = pdVar16;
            pdVar21 = pdVar21 + 1;
            dVar25 = dVar24;
          } while (pdVar21 != pdVar15);
        }
        iVar22 = (int)((ulong)((long)pdVar23 - (long)pdVar14) >> 3);
        piVar13[lVar18 + uVar9] = iVar22;
        if (iVar22 == 0) {
          iVar22 = -1;
          if ((pdVar14 != pdVar15) && (pvVar11 != pvVar12)) {
            if (0.0 < *pdVar14) goto LAB_002a3ba0;
            iVar22 = piVar10[uVar9];
          }
          piVar13[lVar18 + uVar9] = iVar22;
        }
LAB_002a3ba0:
        sVar17 = sVar17 + 1;
      } while (sVar17 != sVar3);
    }
  }
  else if (sVar3 != 0) {
    puVar4 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pvVar11 = (imp->cat_sum).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar12 = (imp->cat_sum).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    piVar13 = prediction_data->categ_data;
    sVar17 = prediction_data->nrows;
    piVar10 = (imputer->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    sVar19 = 0;
    do {
      uVar9 = puVar4[sVar19];
      pdVar14 = pvVar11[uVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar15 = pvVar11[uVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pdVar21 = pdVar14 + 1;
      pdVar23 = pdVar14;
      if (pdVar21 != pdVar15 && pdVar14 != pdVar15) {
        dVar25 = *pdVar14;
        do {
          dVar24 = *pdVar21;
          pdVar16 = pdVar21;
          if (dVar24 <= dVar25) {
            dVar24 = dVar25;
            pdVar16 = pdVar23;
          }
          pdVar23 = pdVar16;
          pdVar21 = pdVar21 + 1;
          dVar25 = dVar24;
        } while (pdVar21 != pdVar15);
      }
      lVar18 = sVar17 * uVar9;
      iVar22 = (int)((ulong)((long)pdVar23 - (long)pdVar14) >> 3);
      piVar13[row + lVar18] = iVar22;
      if (iVar22 == 0) {
        iVar22 = -1;
        if ((pdVar14 != pdVar15) && (pvVar11 != pvVar12)) {
          if (0.0 < *pdVar14) goto LAB_002a3adc;
          iVar22 = piVar10[uVar9];
        }
        piVar13[row + lVar18] = iVar22;
      }
LAB_002a3adc:
      sVar19 = sVar19 + 1;
    } while (sVar19 != sVar3);
  }
  return;
}

Assistant:

void apply_imputation_results(PredictionData  &prediction_data,
                              ImputedData     &imp,
                              Imputer         &imputer,
                              size_t          row)
{
    size_t col;
    size_t pos = 0;
    if (prediction_data.is_col_major)
    {
        for (size_t ix = 0; ix < imp.n_missing_num; ix++)
        {
            col = imp.missing_num[ix];
            if (imp.num_weight[ix] > 0 && !is_na_or_inf(imp.num_sum[ix]) && !(imp.num_sum[ix] == 0 && std::isnan(imputer.col_means[col])))
                prediction_data.numeric_data[row + col * prediction_data.nrows]
                    =
                imp.num_sum[ix] / imp.num_weight[ix];
            else
                prediction_data.numeric_data[row + col * prediction_data.nrows]
                    =
                imputer.col_means[col];
        }
    }

    else
    {
        for (size_t ix = 0; ix < imp.n_missing_num; ix++)
        {
            col = imp.missing_num[ix];
            if (imp.num_weight[ix] > 0 && !is_na_or_inf(imp.num_sum[ix]) && !(imp.num_sum[ix] == 0 && std::isnan(imputer.col_means[col])))
                prediction_data.numeric_data[col + row * imputer.ncols_numeric]
                    =
                imp.num_sum[ix] / imp.num_weight[ix];
            else
                prediction_data.numeric_data[col + row * imputer.ncols_numeric]
                    =
                imputer.col_means[col];
        }
    }

    if (prediction_data.Xr != NULL)
        for (auto ix = prediction_data.Xr_indptr[row]; ix < prediction_data.Xr_indptr[row + 1]; ix++)
        {
            if (is_na_or_inf(prediction_data.Xr[ix]))
            {
                if (imp.sp_num_weight[pos] > 0 && !is_na_or_inf(imp.sp_num_sum[pos]))
                    prediction_data.Xr[ix]
                        =
                    imp.sp_num_sum[pos] / imp.sp_num_weight[pos];
                else
                    prediction_data.Xr[ix]
                        =
                    imputer.col_means[imp.missing_sp[pos]];
                pos++;
            }
        }

    if (prediction_data.is_col_major)
    {
        for (size_t ix = 0; ix < imp.n_missing_cat; ix++)
        {
            col = imp.missing_cat[ix];
            prediction_data.categ_data[row + col * prediction_data.nrows]
                        =
            std::distance(imp.cat_sum[col].begin(),
                          std::max_element(imp.cat_sum[col].begin(), imp.cat_sum[col].end()));

            if (prediction_data.categ_data[row + col * prediction_data.nrows] == 0)
            {
                if (imp.cat_sum.empty() || imp.cat_sum[col].empty())
                {
                    prediction_data.categ_data[row + col * prediction_data.nrows] = -1;
                }

                else if (imp.cat_sum[col][0] <= 0)
                {
                    prediction_data.categ_data[row + col * prediction_data.nrows]
                        =
                    imputer.col_modes[col];
                }
            }
        }
    }

    else
    {
        for (size_t ix = 0; ix < imp.n_missing_cat; ix++)
        {
            col = imp.missing_cat[ix];
            prediction_data.categ_data[col + row * imputer.ncols_categ]
                        =
            std::distance(imp.cat_sum[col].begin(),
                          std::max_element(imp.cat_sum[col].begin(), imp.cat_sum[col].end()));

            if (prediction_data.categ_data[col + row * imputer.ncols_categ] == 0)
            {
                if (imp.cat_sum.empty() || imp.cat_sum[col].empty())
                {
                    prediction_data.categ_data[col + row * imputer.ncols_categ] = -1;
                }
                
                else if (imp.cat_sum[col][0] <= 0)
                {
                    prediction_data.categ_data[col + row * imputer.ncols_categ]
                        =
                    imputer.col_modes[col];
                }
            }
        }
    }
}